

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
copyable_holder_caster<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_void>::
load_value(copyable_holder_caster<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_void>
           *this,value_and_holder *v_h)

{
  void **ppvVar1;
  byte bVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = v_h->inst->field_0x30;
  if ((bVar2 & 2) == 0) {
    bVar2 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar2 = bVar2 & 4;
  }
  if (bVar2 != 0) {
    ppvVar1 = v_h->vh;
    (this->super_type_caster_base<kratos::EventTracingStmt>).super_type_caster_generic.value =
         *ppvVar1;
    (this->holder).super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppvVar1[1];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->holder).
                super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ppvVar1 + 2));
    return true;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  type_id<std::shared_ptr<kratos::EventTracingStmt>>();
  std::operator+(&local_88,
                 "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                 &local_48);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  *(undefined ***)this_00 = &PTR__runtime_error_004c1c08;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool load_value(value_and_holder &&v_h) {
        if (v_h.holder_constructed()) {
            value = v_h.value_ptr();
            holder = v_h.template holder<holder_type>();
            return true;
        }
        throw cast_error("Unable to cast from non-held to held instance (T& to Holder<T>) "
#if defined(NDEBUG)
                         "(compile in debug mode for type information)");
#else
                         "of type '"
                         + type_id<holder_type>() + "''");
#endif
    }